

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O1

bool matchWhileUnsplitting
               (char *buffer,int buffer_len,int start,char *needle,int needle_len,int *matchlen,
               int *lines)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  
  bVar3 = needle_len < 1;
  iVar1 = start;
  if (needle_len < 1) {
LAB_0019884d:
    *matchlen = iVar1 - start;
  }
  else if (start < buffer_len) {
    uVar2 = 1;
    do {
      if (buffer[iVar1] != needle[uVar2 - 1]) {
        return bVar3;
      }
      iVar1 = skipEscapedLineEnds(buffer,buffer_len,iVar1 + 1,lines);
      bVar3 = (uint)needle_len <= uVar2;
      if (uVar2 == (uint)needle_len) goto LAB_0019884d;
      uVar2 = uVar2 + 1;
    } while (iVar1 < buffer_len);
  }
  return bVar3;
}

Assistant:

static bool matchWhileUnsplitting(const char *buffer, int buffer_len, int start,
                                  const char *needle, int needle_len,
                                  int *matchlen, int *lines)
{
    int x = start;
    for (int n = 0; n < needle_len;
         n++, x = skipEscapedLineEnds(buffer, buffer_len, x + 1, lines)) {
        if (x >= buffer_len || buffer[x] != needle[n])
            return false;
    }
    // That also skipped any remaining BSNLs immediately after the match.

    // Tell caller how long the match was:
    *matchlen = x - start;

    return true;
}